

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O3

void __thiscall
ThreadContext::GetActiveFunctions(ThreadContext *this,ActiveFunctionSet *pActiveFuncs)

{
  BOOL BVar1;
  FunctionBody *this_00;
  undefined1 local_d0 [8];
  JavascriptStackWalker walker;
  JavascriptFunction *function;
  
  if ((this->callRootLevel != 0) && (this->entryExitRecord != (ScriptEntryExitRecord *)0x0)) {
    Js::JavascriptStackWalker::JavascriptStackWalker
              ((JavascriptStackWalker *)local_d0,this->scriptContextList,true,(PVOID)0x0,true);
    walker.currentFrame.stackCheckCodeHeight = 0;
    while( true ) {
      BVar1 = Js::JavascriptStackWalker::GetCallerWithoutInlinedFrames
                        ((JavascriptStackWalker *)local_d0,
                         (JavascriptFunction **)&walker.currentFrame.stackCheckCodeHeight);
      if (BVar1 == 0) break;
      if (((*(FunctionInfo **)(walker.currentFrame.stackCheckCodeHeight + 0x28))->functionBodyImpl).
          ptr != (FunctionProxy *)0x0) {
        this_00 = Js::FunctionInfo::GetFunctionBody
                            (*(FunctionInfo **)(walker.currentFrame.stackCheckCodeHeight + 0x28));
        Js::FunctionBody::UpdateActiveFunctionSet
                  (this_00,pActiveFuncs,(FunctionCodeGenRuntimeData *)0x0);
      }
    }
    Js::JavascriptStackWalker::~JavascriptStackWalker((JavascriptStackWalker *)local_d0);
  }
  return;
}

Assistant:

void
ThreadContext::GetActiveFunctions(ActiveFunctionSet * pActiveFuncs)
{
    if (!this->IsInScript() || this->entryExitRecord == nullptr)
    {
        return;
    }

    Js::JavascriptStackWalker walker(GetScriptContextList(), TRUE, NULL, true);
    Js::JavascriptFunction *function = nullptr;
    while (walker.GetCallerWithoutInlinedFrames(&function))
    {
        if (function->GetFunctionInfo()->HasBody())
        {
            Js::FunctionBody *body = function->GetFunctionInfo()->GetFunctionBody();
            body->UpdateActiveFunctionSet(pActiveFuncs, nullptr);
        }
    }
}